

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistwidget.cpp
# Opt level: O0

char * __thiscall QListModel::index(QListModel *this,char *__s,int __c)

{
  int iVar1;
  long lVar2;
  bool bVar3;
  QAbstractItemModel *pQVar4;
  qsizetype qVar5;
  const_reference ppQVar6;
  undefined4 in_register_00000014;
  QListWidgetItem *pQVar7;
  long in_FS_OFFSET;
  int theid;
  int row;
  QListWidgetItem *item;
  QListWidgetItem **in_stack_ffffffffffffffb8;
  QListModel *pQVar8;
  
  pQVar7 = (QListWidgetItem *)CONCAT44(in_register_00000014,__c);
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar8 = this;
  if ((((pQVar7 == (QListWidgetItem *)0x0) || (pQVar7->view == (QListWidget *)0x0)) ||
      (pQVar4 = QAbstractItemView::model((QAbstractItemView *)__s),
      pQVar4 != (QAbstractItemModel *)__s)) ||
     (bVar3 = QList<QListWidgetItem_*>::isEmpty((QList<QListWidgetItem_*> *)0x89a298), bVar3)) {
    QModelIndex::QModelIndex((QModelIndex *)0x89a2a8);
    goto LAB_0089a371;
  }
  iVar1 = pQVar7->d->theid;
  if (iVar1 < 0) {
LAB_0089a316:
    qVar5 = QListSpecialMethodsBase<QListWidgetItem*>::lastIndexOf<QListWidgetItem*>
                      ((QListSpecialMethodsBase<QListWidgetItem_*> *)this,in_stack_ffffffffffffffb8,
                       0x89a330);
    if ((int)qVar5 == -1) {
      QModelIndex::QModelIndex((QModelIndex *)0x89a345);
      goto LAB_0089a371;
    }
    pQVar7->d->theid = (int)qVar5;
  }
  else {
    in_stack_ffffffffffffffb8 = (QListWidgetItem **)(long)iVar1;
    qVar5 = QList<QListWidgetItem_*>::size
                      ((QList<QListWidgetItem_*> *)((QAbstractItemModel *)__s + 0x10));
    if ((qVar5 <= (long)in_stack_ffffffffffffffb8) ||
       (ppQVar6 = QList<QListWidgetItem_*>::at
                            ((QList<QListWidgetItem_*> *)this,(qsizetype)in_stack_ffffffffffffffb8),
       *ppQVar6 != pQVar7)) goto LAB_0089a316;
  }
  QAbstractItemModel::createIndex
            ((QAbstractItemModel *)__s,(int)((ulong)pQVar8 >> 0x20),(int)pQVar8,this);
LAB_0089a371:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) {
    __stack_chk_fail();
  }
  return (char *)pQVar8;
}

Assistant:

QModelIndex QListModel::index(const QListWidgetItem *item_) const
{
    QListWidgetItem *item = const_cast<QListWidgetItem *>(item_);
    if (!item || !item->view || static_cast<const QListModel *>(item->view->model()) != this
        || items.isEmpty())
        return QModelIndex();
    int row;
    const int theid = item->d->theid;
    if (theid >= 0 && theid < items.size() && items.at(theid) == item) {
        row = theid;
    } else { // we need to search for the item
        row = items.lastIndexOf(item);  // lastIndexOf is an optimization in favor of indexOf
        if (row == -1) // not found
            return QModelIndex();
        item->d->theid = row;
    }
    return createIndex(row, 0, item);
}